

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadjointcheckpointscheme_fixed.c
# Opt level: O2

SUNErrCode
SUNAdjointCheckpointScheme_InsertVector_Fixed
          (SUNAdjointCheckpointScheme self,suncountertype step_num,suncountertype stage_num,
          sunrealtype t,N_Vector y)

{
  SUNContext pSVar1;
  char *__ptr;
  void *pvVar2;
  SUNDataNode step_data_node;
  SUNDataNode solution_node;
  undefined8 local_40;
  sunrealtype local_38;
  undefined8 local_30;
  
  pSVar1 = self->sunctx;
  local_40 = 0;
  pvVar2 = self->content;
  local_38 = t;
  if (*(long *)((long)pvVar2 + 0x10) == step_num) {
    local_40 = *(undefined8 *)((long)pvVar2 + 0x30);
  }
  else {
    SUNDataNode_CreateList(*(undefined4 *)((long)pvVar2 + 0x40),0,pSVar1,&local_40);
    pvVar2 = self->content;
    *(undefined8 *)((long)pvVar2 + 0x30) = local_40;
    *(suncountertype *)((long)pvVar2 + 0x10) = step_num;
    __ptr = sunSignedToString(step_num);
    SUNDataNode_AddNamedChild(*(undefined8 *)((long)self->content + 0x28),__ptr,local_40);
    free(__ptr);
    pvVar2 = self->content;
  }
  local_30 = 0;
  SUNDataNode_CreateLeaf
            (*(undefined4 *)((long)pvVar2 + 0x40),*(undefined8 *)((long)pvVar2 + 0x20),pSVar1,
             &local_30);
  SUNDataNode_SetDataNvector(local_38,local_30,y);
  SUNDataNode_AddChild(local_40,local_30);
  return 0;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_InsertVector_Fixed(
  SUNAdjointCheckpointScheme self, suncountertype step_num,
  SUNDIALS_MAYBE_UNUSED suncountertype stage_num, sunrealtype t, N_Vector y)
{
  SUNFunctionBegin(self->sunctx);

  /* If this is the first state for a step, then we need to create a
     list node first to store the step and all stage solutions in.
     We keep a pointer to the list node until this step is over for
     fast access when inserting stages. */
  SUNDataNode step_data_node = NULL;
  if (step_num != IMPL_MEMBER(self, step_num_of_current_insert))
  {
    SUNCheckCall(SUNDataNode_CreateList(IMPL_MEMBER(self, io_mode), 0, SUNCTX_,
                                        &step_data_node));
    IMPL_MEMBER(self, current_insert_step_node)   = step_data_node;
    IMPL_MEMBER(self, step_num_of_current_insert) = step_num;

    /* Store the step node in the root node object. */
    char* key = sunSignedToString(step_num);
    SUNLogExtraDebug(SUNCTX_->logger, "insert-new-step",
                     "step_num = %d, key = %s", step_num, key);
    SUNCheckCall(SUNDataNode_AddNamedChild(IMPL_MEMBER(self, root_node), key,
                                           step_data_node));
    free(key);
  }
  else { step_data_node = IMPL_MEMBER(self, current_insert_step_node); }

  /* Add the state data as a leaf node in the step node's list of children. */
  SUNDataNode solution_node = NULL;
  SUNCheckCall(SUNDataNode_CreateLeaf(IMPL_MEMBER(self, io_mode),
                                      IMPL_MEMBER(self, mem_helper), SUNCTX_,
                                      &solution_node));
  SUNCheckCall(SUNDataNode_SetDataNvector(solution_node, y, t));

  SUNLogExtraDebug(SUNCTX_->logger, "insert-stage",
                   "step_num = %d, stage_num = %d, t = %g", step_num, stage_num,
                   t);
  SUNCheckCall(SUNDataNode_AddChild(step_data_node, solution_node));

  return SUN_SUCCESS;
}